

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_addis(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 ret;
  uintptr_t o;
  uint uVar2;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  uVar2 = uVar1 >> 0x10 & 0x1f;
  ret = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 0x12 & 0xf8));
  if (uVar2 != 0) {
    tcg_gen_addi_i64_ppc64(tcg_ctx,ret,cpu_gpr[uVar2],(long)(short)uVar1 << 0x10);
    return;
  }
  tcg_gen_op2_ppc64(tcg_ctx,INDEX_op_movi_i64,(TCGArg)(ret + (long)tcg_ctx),
                    (long)(short)uVar1 << 0x10);
  return;
}

Assistant:

static void gen_addis(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    target_long simm = SIMM(ctx->opcode);

    if (rA(ctx->opcode) == 0) {
        /* lis case */
        tcg_gen_movi_tl(tcg_ctx, cpu_gpr[rD(ctx->opcode)], simm << 16);
    } else {
        tcg_gen_addi_tl(tcg_ctx, cpu_gpr[rD(ctx->opcode)],
                        cpu_gpr[rA(ctx->opcode)], simm << 16);
    }
}